

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

faidx_t * fai_read(FILE *fp)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  faidx_t *idx;
  kh_s_t *pkVar4;
  char *__s;
  char *pcVar5;
  ushort **ppuVar6;
  int line_blen;
  int line_len;
  int len;
  longlong offset;
  
  idx = (faidx_t *)calloc(1,0x20);
  pkVar4 = kh_init_s();
  idx->hash = pkVar4;
  __s = (char *)calloc(0x10000,1);
  do {
    iVar3 = feof((FILE *)fp);
    if ((iVar3 != 0) ||
       (pcVar5 = fgets(__s,0x10000,(FILE *)fp), pcVar2 = __s, pcVar5 == (char *)0x0)) {
      free(__s);
      return idx;
    }
    do {
      pcVar5 = pcVar2;
      cVar1 = *pcVar5;
      if ((long)cVar1 == 0) break;
      ppuVar6 = __ctype_b_loc();
      pcVar2 = pcVar5 + 1;
    } while ((short)(*ppuVar6)[cVar1] < 0);
    *pcVar5 = '\0';
    __isoc99_sscanf(pcVar5 + 1,"%d%lld%d%d",&len,&offset,&line_blen,&line_len);
    fai_insert_index(idx,__s,len,line_len,line_blen,offset);
  } while( true );
}

Assistant:

faidx_t *fai_read(FILE *fp)
{
    faidx_t *fai;
    char *buf, *p;
    int len, line_len, line_blen;
#ifdef _WIN32
    long offset;
#else
    long long offset;
#endif
    fai = (faidx_t*)calloc(1, sizeof(faidx_t));
    fai->hash = kh_init(s);
    buf = (char*)calloc(0x10000, 1);
    while (!feof(fp) && fgets(buf, 0x10000, fp)) {
        for (p = buf; *p && isgraph(*p); ++p);
        *p = 0; ++p;
#ifdef _WIN32
        sscanf(p, "%d%ld%d%d", &len, &offset, &line_blen, &line_len);
#else
        sscanf(p, "%d%lld%d%d", &len, &offset, &line_blen, &line_len);
#endif
        fai_insert_index(fai, buf, len, line_len, line_blen, offset);
    }
    free(buf);
    return fai;
}